

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getopt_pp.h
# Opt level: O3

Result __thiscall
GetOpt::_OptionTBase<int>::operator()
          (_OptionTBase<int> *this,ShortOptions *short_ops,LongOptions *long_ops,Token *param_3,
          fmtflags flags)

{
  _Rb_tree_header *p_Var1;
  char cVar2;
  undefined1 uVar3;
  Result RVar4;
  _Base_ptr p_Var5;
  iterator iVar6;
  _Base_ptr *pp_Var7;
  _Base_ptr p_Var8;
  
  cVar2 = this->short_opt;
  if ((cVar2 != '\0') &&
     (p_Var8 = (short_ops->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent,
     p_Var8 != (_Base_ptr)0x0)) {
    p_Var1 = &(short_ops->_M_t)._M_impl.super__Rb_tree_header;
    p_Var5 = &p_Var1->_M_header;
    do {
      uVar3 = (undefined1)p_Var8[1]._M_color;
      if (cVar2 <= (char)uVar3) {
        p_Var5 = p_Var8;
      }
      p_Var8 = (&p_Var8->_M_left)[(char)uVar3 < cVar2];
    } while (p_Var8 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var5 != p_Var1) && ((char)p_Var5[1]._M_color <= cVar2)) {
      *(undefined4 *)&p_Var5[1]._M_parent = 1;
      pp_Var7 = &p_Var5[1]._M_left;
      goto LAB_0010437f;
    }
  }
  if ((this->long_opt)._M_string_length != 0) {
    iVar6 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GetOpt::OptionData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GetOpt::OptionData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GetOpt::OptionData>_>_>
            ::find(&long_ops->_M_t,&this->long_opt);
    if ((_Rb_tree_header *)iVar6._M_node != &(long_ops->_M_t)._M_impl.super__Rb_tree_header) {
      iVar6._M_node[2]._M_color = _S_black;
      pp_Var7 = &iVar6._M_node[2]._M_parent;
LAB_0010437f:
      RVar4 = (*(this->super__Option)._vptr__Option[3])(this,*pp_Var7,(ulong)(uint)flags,short_ops);
      return RVar4;
    }
  }
  return OptionNotFound;
}

Assistant:

virtual Result operator()(ShortOptions& short_ops, LongOptions& long_ops, Token* /*first*/, std::ios::fmtflags flags) const
    {
        Result ret = OptionNotFound;
        ShortOptions::iterator it;
        if (short_opt == _Option::NO_SHORT_OPT)
            it = short_ops.end();
        else
            it = short_ops.find(short_opt);

        if (it != short_ops.end())
        {
            it->second.flags = OptionData::CmdLine_Extracted;
            ret = _assign(it->second.token, flags, short_ops);
        }
        else if (!long_opt.empty())
        {
            LongOptions::iterator it = long_ops.find(long_opt);
            if (it != long_ops.end())
            {
                it->second.flags = OptionData::CmdLine_Extracted;
                ret = _assign(it->second.token, flags, short_ops);
            }
        }

        return ret;
    }